

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O0

void __thiscall DBSCAN::KeyEmbCluster(DBSCAN *this,uint emb_id,int clusterId)

{
  bool bVar1;
  uint emb_id_00;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Embedding *pEVar3;
  reference pvVar4;
  Embedding *des_emb;
  unsigned_long i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arrval_embs;
  Embedding *src_emb;
  int clusterId_local;
  uint emb_id_local;
  DBSCAN *this_local;
  
  pvVar2 = std::vector<Embedding,_std::allocator<Embedding>_>::operator[](&this->embs,(ulong)emb_id)
  ;
  bVar1 = Embedding::IsKey(pvVar2);
  if (bVar1) {
    this_00 = Embedding::GetArrivalEmbs(pvVar2);
    for (des_emb = (Embedding *)0x0;
        pEVar3 = (Embedding *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00),
        des_emb < pEVar3; des_emb = (Embedding *)((long)&des_emb->emb_id + 1)) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_00,(size_type)des_emb);
      pvVar2 = std::vector<Embedding,_std::allocator<Embedding>_>::operator[]
                         (&this->embs,(ulong)*pvVar4);
      bVar1 = Embedding::IsVisited(pvVar2);
      if (!bVar1) {
        Embedding::SetClusterID(pvVar2,clusterId);
        Embedding::SetVisited(pvVar2,true);
        bVar1 = Embedding::IsKey(pvVar2);
        if (bVar1) {
          emb_id_00 = Embedding::GetEmbID(pvVar2);
          KeyEmbCluster(this,emb_id_00,clusterId);
        }
      }
    }
  }
  return;
}

Assistant:

void DBSCAN::KeyEmbCluster(unsigned int emb_id, int clusterId)
{
    Embedding& src_emb = this->embs[emb_id];        //获取数据点对象
    if(!src_emb.IsKey())
        return;
    std::vector<unsigned int>& arrval_embs = src_emb.GetArrivalEmbs();        //获取对象领域内点ID列表
    for(unsigned long i=0; i<arrval_embs.size(); i++)
    {
        Embedding& des_emb = this->embs[arrval_embs[i]];    //获取领域内点数据点
        if(!des_emb.IsVisited())                            //若该对象没有被访问过执行
        {
            //cout << "数据点\t"<< desDp.GetDpId()<<"聚类ID为\t" <<clusterId << endl;
            des_emb.SetClusterID(clusterId);        //设置该对象所属簇的ID为clusterId，即将该对象吸入簇中
            des_emb.SetVisited(true);                //设置该对象已被访问
            if(des_emb.IsKey())                    //若该对象是核心对象
            {
                KeyEmbCluster(des_emb.GetEmbID(),clusterId);    //递归地对该领域点数据的领域内的点执行聚类操作，采用深度优先方法
            }
        }
    }
}